

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putseparate8bitYCbCr11tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  uint *puVar4;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t db;
  uint32_t dg;
  uint32_t dr;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  dr = w;
  h_local = y;
  _y_local = cp;
  cp_local = (uint32_t *)img;
  for (dg = h; dg != 0; dg = dg - 1) {
    w_local = dr;
    do {
      puVar1 = r + 1;
      puVar2 = g + 1;
      puVar3 = b + 1;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*r,(uint)*g,(uint)*b,&db,&local_30,
                     &local_34);
      puVar4 = _y_local + 1;
      *_y_local = db | local_30 << 8 | local_34 << 0x10 | 0xff000000;
      w_local = w_local - 1;
      r = puVar1;
      g = puVar2;
      b = puVar3;
      _y_local = puVar4;
    } while (w_local != 0);
    r = puVar1 + fromskew;
    g = puVar2 + fromskew;
    b = puVar3 + fromskew;
    _y_local = puVar4 + toskew;
  }
  return;
}

Assistant:

DECLARESepPutFunc(putseparate8bitYCbCr11tile)
{
    (void)y;
    (void)a;
    /* TODO: naming of input vars is still off, change obfuscating declaration
     * inside define, or resolve obfuscation */
    for (; h > 0; --h)
    {
        x = w;
        do
        {
            uint32_t dr, dg, db;
            TIFFYCbCrtoRGB(img->ycbcr, *r++, *g++, *b++, &dr, &dg, &db);
            *cp++ = PACK(dr, dg, db);
        } while (--x);
        SKEW(r, g, b, fromskew);
        cp += toskew;
    }
}